

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

void __thiscall position::position(position *this,position *p)

{
  haVoc::Movehistory::Movehistory(&this->stats);
  (this->bestmove)._M_dataplus._M_p = (pointer)&(this->bestmove).field_2;
  (this->bestmove)._M_string_length = 0;
  (this->bestmove).field_2._M_local_buf[0] = '\0';
  parameters::parameters(&this->params);
  this->debug_search = false;
  (this->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator=(this,p);
  return;
}

Assistant:

position::position(const position& p) { 
	*this = p;
}